

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O3

void __thiscall
KktChStep::passSolution
          (KktChStep *this,vector<double,_std::allocator<double>_> *colVal,
          vector<double,_std::allocator<double>_> *colDu,
          vector<double,_std::allocator<double>_> *rDu)

{
  pointer piVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  vector<int,_std::allocator<int>_> eqIndexOfReduced;
  vector<int,_std::allocator<int>_> eqIndexOfReduROW;
  vector<int,_std::allocator<int>_> cIndex;
  vector<int,_std::allocator<int>_> rIndex;
  allocator_type local_ad;
  value_type local_ac;
  vector<int,_std::allocator<int>_> local_a8;
  vector<double,_std::allocator<double>_> *local_90;
  vector<double,_std::allocator<double>_> *local_88;
  vector<double,_std::allocator<double>_> *local_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_88 = &this->colValue;
  local_90 = colVal;
  std::vector<double,_std::allocator<double>_>::resize(local_88,(long)this->RnumCol);
  std::vector<double,_std::allocator<double>_>::resize(&this->colDual,(long)this->RnumCol);
  local_80 = &this->rowDual;
  std::vector<double,_std::allocator<double>_>::resize(local_80,(long)this->RnumRow);
  this->numRow = (int)((ulong)((long)(rDu->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(rDu->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start) >> 3);
  this->numCol = (int)((ulong)((long)(colDu->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(colDu->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)this->RnumRow,(value_type *)&local_60,(allocator_type *)&local_a8);
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_60,(long)this->RnumCol,(value_type *)&local_a8,(allocator_type *)&local_78);
  iVar6 = this->RnumRow;
  if (0 < iVar6) {
    piVar1 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    iVar8 = 0;
    do {
      if (piVar1[lVar7] != 0) {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar7] = iVar8;
        iVar8 = iVar8 + 1;
        iVar6 = this->RnumRow;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar6);
  }
  iVar6 = this->RnumCol;
  if (0 < iVar6) {
    piVar1 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    iVar8 = 0;
    do {
      if (piVar1[lVar7] != 0) {
        *(int *)(CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + lVar7 * 4) = iVar8;
        iVar8 = iVar8 + 1;
        iVar6 = this->RnumCol;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar6);
  }
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_a8,(long)this->numCol,(value_type *)&local_78,(allocator_type *)&local_ac);
  local_ac = -1;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,(long)this->numRow,&local_ac,&local_ad);
  iVar6 = this->RnumCol;
  if (0 < iVar6) {
    lVar7 = 0;
    iVar8 = 0;
    do {
      if (-1 < *(int *)(CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_4_) + lVar7 * 4)) {
        *(int *)(CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + (long)iVar8 * 4) = (int)lVar7;
        iVar8 = iVar8 + 1;
        iVar6 = this->RnumCol;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar6);
  }
  iVar6 = this->RnumRow;
  if (0 < iVar6) {
    lVar7 = 0;
    iVar8 = 0;
    do {
      if (-1 < local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7]) {
        *(int *)(CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + (long)iVar8 * 4) = (int)lVar7;
        iVar8 = iVar8 + 1;
        iVar6 = this->RnumRow;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar6);
  }
  iVar6 = this->numCol;
  if (0 < (long)iVar6) {
    pdVar2 = (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (colDu->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      iVar8 = *(int *)(CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + lVar7 * 4);
      pdVar3[iVar8] = pdVar2[lVar7];
      pdVar5[iVar8] = pdVar4[lVar7];
      lVar7 = lVar7 + 1;
    } while (iVar6 != lVar7);
  }
  iVar6 = this->numRow;
  if (0 < (long)iVar6) {
    pdVar2 = (rDu->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      pdVar3[*(int *)(CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_) + lVar7 * 4)] = pdVar2[lVar7]
      ;
      lVar7 = lVar7 + 1;
    } while (iVar6 != lVar7);
  }
  if ((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void KktChStep::passSolution(const vector<double>& colVal, const vector<double>& colDu, const vector<double>& rDu) {

	colValue.resize(RnumCol);
	colDual.resize(RnumCol);
	rowDual.resize(RnumRow);
	
	numRow = rDu.size();
	numCol = colDu.size();
	//arrays to keep track of indices
	vector<int> rIndex(RnumRow, -1);
	vector<int> cIndex(RnumCol, -1);
	int nR = 0;
	int nC = 0;
	
	for (int i=0;i<RnumRow;i++)
		if (flagRow[i]) {
			rIndex[i] = nR;
			nR++;
			}
			
	for (int i=0;i<RnumCol;i++)
		if (flagCol[i]) {
			cIndex[i] = nC;
			nC++;
		}
		
	//set corresponding parts of solution vectors:
	int j=0;
	vector<int> eqIndexOfReduced(numCol, -1);
	vector<int> eqIndexOfReduROW(numRow, -1);
	for (int i=0;i<RnumCol;i++)
		if (cIndex[i]>-1) {
			eqIndexOfReduced[j] = i;
			j++;
		}
	j=0;
	for (int i=0;i<RnumRow;i++)
		if (rIndex[i]>-1) {
			eqIndexOfReduROW[j] = i;
			j++;
		}
	
	for (int i=0;i<numCol;i++) {
		colValue[eqIndexOfReduced[i]] = colVal[i];
		colDual[eqIndexOfReduced[i]] = colDu[i];
	}
	
	for (int i=0;i<numRow;i++)
		rowDual[eqIndexOfReduROW[i]] = rDu[i];
	
}